

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

void done_eating(boolean message)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  boolean message_local;
  
  *(uint *)&(victual.piece)->field_0x4a =
       *(uint *)&(victual.piece)->field_0x4a & 0xff7fffff | 0x800000;
  occupation = (_func_int *)0x0;
  newuhs('\0');
  if (nomovemsg == (char *)0x0) {
    if (message != '\0') {
      pcVar2 = "eating";
      if ((*(uint *)&(victual.piece)->field_0x4a >> 0x1b & 1) != 0) {
        pcVar2 = "draining";
      }
      pcVar3 = food_xname(victual.piece,'\x01');
      pline("You finish %s %s.",pcVar2,pcVar3);
    }
  }
  else {
    if (message != '\0') {
      pline(nomovemsg);
    }
    nomovemsg = (char *)0x0;
  }
  if ((victual.piece)->otyp == 0x10e) {
    if (((*(uint *)&(victual.piece)->field_0x4a >> 0x1b & 1) == 0) ||
       ((urace.malenum == 0xe8 && (iVar1 = rn2(5), iVar1 == 0)))) {
      cpostfx((victual.piece)->corpsenm);
    }
  }
  else {
    fpostfx(victual.piece);
  }
  if ((*(uint *)&(victual.piece)->field_0x4a >> 0x1b & 1) == 0) {
    if ((victual.piece)->where == '\x03') {
      useup(victual.piece);
    }
    else {
      useupf(victual.piece,1);
    }
  }
  else {
    *(uint *)&(victual.piece)->field_0x4a = *(uint *)&(victual.piece)->field_0x4a & 0xff7fffff;
  }
  victual.piece = (obj *)0x0;
  victual._20_1_ = victual._20_1_ & 0xf1;
  return;
}

Assistant:

static void done_eating(boolean message)
{
	victual.piece->in_use = TRUE;
	occupation = 0; /* do this early, so newuhs() knows we're done */
	newuhs(FALSE);
	if (nomovemsg) {
		if (message) pline(nomovemsg);
		nomovemsg = 0;
	} else if (message)
		pline("You finish %s %s.",
		      victual.piece->odrained ? "draining" : "eating",
		      food_xname(victual.piece, TRUE));

	if (victual.piece->otyp == CORPSE) {
		if (!victual.piece->odrained || (Race_if(PM_VAMPIRE) && !rn2(5)))
			cpostfx(victual.piece->corpsenm);
	} else {
		fpostfx(victual.piece);
	}

	if (victual.piece->odrained)
		victual.piece->in_use = FALSE;
	else if (carried(victual.piece))
		useup(victual.piece);
	else
		useupf(victual.piece, 1L);
	victual.piece = NULL;
	victual.fullwarn = victual.eating = victual.doreset = FALSE;
}